

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

Molecule * __thiscall
OpenMD::SelectionManager::nextUnselectedMolecule(SelectionManager *this,int *i)

{
  int iVar1;
  reference ppMVar2;
  int *in_RSI;
  OpenMDBitSet *in_RDI;
  undefined8 in_stack_ffffffffffffffe0;
  value_type pMVar3;
  
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
             &(in_RDI->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,5);
  iVar1 = OpenMDBitSet::nextOffBit(in_RDI,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  *in_RSI = iVar1;
  if (*in_RSI == -1) {
    pMVar3 = (value_type)0x0;
  }
  else {
    ppMVar2 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                        ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                         &in_RDI[4].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish,(long)*in_RSI);
    pMVar3 = *ppMVar2;
  }
  return pMVar3;
}

Assistant:

Molecule* SelectionManager::nextUnselectedMolecule(int& i) {
#ifdef IS_MPI
    ++i;
    while (i < static_cast<int>(ss_.bitsets_[MOLECULE].size())) {
      if (!ss_.bitsets_[MOLECULE][i]) {
        // check that this processor owns this molecule
        if (molecules_[i] != NULL) return molecules_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[MOLECULE].nextOffBit(i);
    return i == -1 ? NULL : molecules_[i];
#endif
  }